

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxmainsm.hpp
# Opt level: O2

void __thiscall
soplex::
SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::RowSingletonPS::execute
          (RowSingletonPS *this,
          VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          *x,VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             *y,VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                *s,VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   *r,
          DataArray<soplex::SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::VarStatus>
          *cStatus,DataArray<soplex::SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::VarStatus>
                   *rStatus,bool isOptimal)

{
  uint *puVar1;
  undefined8 uVar2;
  Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pNVar3;
  pointer pnVar4;
  type_conflict5 tVar5;
  bool bVar6;
  _func_int **pp_Var7;
  pointer pnVar8;
  int iVar9;
  cpp_dec_float<50U,_int,_void> *pcVar10;
  cpp_dec_float<50u,int,void> *this_00;
  long lVar11;
  int k;
  long lVar12;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *pnVar13;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *pnVar14;
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pVVar15;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result_1;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  newLo;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  newUp;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  aij;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result_6;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result_5;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result_3;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result_2;
  cpp_dec_float<50U,_int,_void> local_d58;
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *local_d20;
  cpp_dec_float<50U,_int,_void> local_d18;
  cpp_dec_float<50U,_int,_void> local_cd8;
  cpp_dec_float<50U,_int,_void> local_c98;
  cpp_dec_float<50U,_int,_void> local_c58;
  long local_c20;
  uint auStack_c18 [2];
  uint local_c10 [6];
  int local_bf8;
  byte local_bf4;
  fpclass_type local_bf0;
  int32_t iStack_bec;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_be8;
  cpp_dec_float<50U,_int,_void> local_ba8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_b68;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_b28;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_ae8;
  cpp_dec_float<50U,_int,_void> local_aa8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_a68;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_a28;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_9e8;
  cpp_dec_float<50U,_int,_void> local_9a8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_968;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_928;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_8e8;
  cpp_dec_float<50U,_int,_void> local_8a8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_868;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_828;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_7e8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_7a8;
  cpp_dec_float<50U,_int,_void> local_768;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_728;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_6e8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_6a8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_668;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_628;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_5e8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_5a8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_568;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_528;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_4e8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_4a8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_468;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_428;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_3e8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_3b0;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_378;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_340;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_308;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_2d0;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_298;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_260;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_228;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_1f0;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_1b8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_180;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_148;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_110;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_d8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_a0;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_68;
  
  iVar9 = this->m_i;
  if (iVar9 != this->m_old_i) {
    pnVar8 = (y->val).
             super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator=
              (&pnVar8[this->m_old_i].m_backend,&pnVar8[iVar9].m_backend);
    pnVar8 = (s->val).
             super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator=
              (&pnVar8[this->m_old_i].m_backend,&pnVar8[this->m_i].m_backend);
    iVar9 = this->m_i;
    rStatus->data[this->m_old_i] = rStatus->data[iVar9];
  }
  SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::operator[]((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                *)&local_c58,
               &(this->m_col).
                super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ,iVar9);
  local_d58.fpclass = cpp_dec_float_finite;
  local_d58.prec_elem = 10;
  local_d58.data._M_elems[0] = 0;
  local_d58.data._M_elems[1] = 0;
  local_d58.data._M_elems[2] = 0;
  local_d58.data._M_elems[3] = 0;
  local_d58.data._M_elems[4] = 0;
  local_d58.data._M_elems[5] = 0;
  local_d58.data._M_elems._24_5_ = 0;
  local_d58.data._M_elems[7]._1_3_ = 0;
  local_d58.data._M_elems._32_5_ = 0;
  local_d58.data._M_elems[9]._1_3_ = 0;
  local_d58.exp = 0;
  local_d58.neg = false;
  boost::multiprecision::default_ops::
  eval_multiply_default<boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
            (&local_d58,&local_c58,
             &(x->val).
              super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
              ._M_impl.super__Vector_impl_data._M_start[this->m_j].m_backend);
  iVar9 = this->m_i;
  pnVar8 = (s->val).
           super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  *(ulong *)(pnVar8[iVar9].m_backend.data._M_elems + 8) =
       CONCAT35(local_d58.data._M_elems[9]._1_3_,local_d58.data._M_elems._32_5_);
  puVar1 = pnVar8[iVar9].m_backend.data._M_elems + 4;
  *(undefined8 *)puVar1 = local_d58.data._M_elems._16_8_;
  *(ulong *)(puVar1 + 2) = CONCAT35(local_d58.data._M_elems[7]._1_3_,local_d58.data._M_elems._24_5_)
  ;
  *(undefined8 *)&pnVar8[iVar9].m_backend.data = local_d58.data._M_elems._0_8_;
  *(undefined8 *)(pnVar8[iVar9].m_backend.data._M_elems + 2) = local_d58.data._M_elems._8_8_;
  pnVar8[iVar9].m_backend.exp = local_d58.exp;
  pnVar8[iVar9].m_backend.neg = local_d58.neg;
  pnVar8[iVar9].m_backend.fpclass = local_d58.fpclass;
  pnVar8[iVar9].m_backend.prec_elem = local_d58.prec_elem;
  uVar2 = *(undefined8 *)((this->m_obj).m_backend.data._M_elems + 8);
  local_d58.data._M_elems._32_5_ = SUB85(uVar2,0);
  local_d58.data._M_elems[9]._1_3_ = (undefined3)((ulong)uVar2 >> 0x28);
  local_d58.data._M_elems._0_8_ = *(undefined8 *)(this->m_obj).m_backend.data._M_elems;
  local_d58.data._M_elems._8_8_ = *(undefined8 *)((this->m_obj).m_backend.data._M_elems + 2);
  local_d58.data._M_elems._16_8_ = *(undefined8 *)((this->m_obj).m_backend.data._M_elems + 4);
  uVar2 = *(undefined8 *)((this->m_obj).m_backend.data._M_elems + 6);
  local_d58.data._M_elems._24_5_ = SUB85(uVar2,0);
  local_d58.data._M_elems[7]._1_3_ = (undefined3)((ulong)uVar2 >> 0x28);
  local_d58.exp = (this->m_obj).m_backend.exp;
  local_d58.neg = (this->m_obj).m_backend.neg;
  local_d58.fpclass = (this->m_obj).m_backend.fpclass;
  local_d58.prec_elem = (this->m_obj).m_backend.prec_elem;
  lVar11 = 0;
  for (lVar12 = 0;
      lVar12 < (this->m_col).
               super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               .memused; lVar12 = lVar12 + 1) {
    pNVar3 = (this->m_col).
             super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             .m_elem;
    iVar9 = *(int *)((long)(&pNVar3->val + 1) + lVar11);
    if (iVar9 != this->m_i) {
      local_cd8.fpclass = cpp_dec_float_finite;
      local_cd8.prec_elem = 10;
      local_cd8.data._M_elems[0] = 0;
      local_cd8.data._M_elems[1] = 0;
      local_cd8.data._M_elems[2] = 0;
      local_cd8.data._M_elems[3] = 0;
      local_cd8.data._M_elems[4] = 0;
      local_cd8.data._M_elems[5] = 0;
      local_cd8.data._M_elems._24_5_ = 0;
      local_cd8.data._M_elems[7]._1_3_ = 0;
      local_cd8.data._M_elems._32_5_ = 0;
      local_cd8.data._M_elems[9]._1_3_ = 0;
      local_cd8.exp = 0;
      local_cd8.neg = false;
      boost::multiprecision::default_ops::
      eval_multiply_default<boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                (&local_cd8,
                 (cpp_dec_float<50U,_int,_void> *)
                 ((long)(pNVar3->val).m_backend.data._M_elems + lVar11),
                 &(y->val).
                  super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                  ._M_impl.super__Vector_impl_data._M_start[iVar9].m_backend);
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator-=
                (&local_d58,&local_cd8);
    }
    lVar11 = lVar11 + 0x3c;
  }
  local_c98.data._M_elems._0_8_ = local_c98.data._M_elems._0_8_ & 0xffffffff00000000;
  local_d20 = y;
  tVar5 = boost::multiprecision::operator>
                    ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                      *)&local_c58,(int *)&local_c98);
  local_cd8.fpclass = cpp_dec_float_finite;
  local_cd8.prec_elem = 10;
  local_cd8.data._M_elems[0] = 0;
  local_cd8.data._M_elems[1] = 0;
  local_cd8.data._M_elems[2] = 0;
  local_cd8.data._M_elems[3] = 0;
  local_cd8.data._M_elems[4] = 0;
  local_cd8.data._M_elems[5] = 0;
  local_cd8.data._M_elems._24_5_ = 0;
  local_cd8.data._M_elems[7]._1_3_ = 0;
  local_cd8.data._M_elems._32_5_ = 0;
  local_cd8.data._M_elems[9]._1_3_ = 0;
  local_cd8.exp = 0;
  local_cd8.neg = false;
  pnVar14 = &this->m_lhs;
  pcVar10 = &(this->m_rhs).m_backend;
  if (tVar5) {
    pcVar10 = &pnVar14->m_backend;
  }
  boost::multiprecision::default_ops::
  eval_divide_default<boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
            (&local_cd8,pcVar10,&local_c58);
  local_d18.data._M_elems._0_8_ = (ulong)local_d18.data._M_elems[1] << 0x20;
  tVar5 = boost::multiprecision::operator>
                    ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                      *)&local_c58,(int *)&local_d18);
  pcVar10 = &(this->m_rhs).m_backend;
  if (!tVar5) {
    pcVar10 = &pnVar14->m_backend;
  }
  local_c98.fpclass = cpp_dec_float_finite;
  local_c98.prec_elem = 10;
  local_c98.data._M_elems[0] = 0;
  local_c98.data._M_elems[1] = 0;
  local_c98.data._M_elems[2] = 0;
  local_c98.data._M_elems[3] = 0;
  local_c98.data._M_elems[4] = 0;
  local_c98.data._M_elems[5] = 0;
  local_c98.data._M_elems[6] = 0;
  local_c98.data._M_elems[7] = 0;
  local_c98.data._M_elems._32_5_ = 0;
  local_c98.data._M_elems[9]._1_3_ = 0;
  local_c98.exp = 0;
  local_c98.neg = false;
  boost::multiprecision::default_ops::
  eval_divide_default<boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
            (&local_c98,pcVar10,&local_c58);
  iVar9 = this->m_j;
  switch(cStatus->data[iVar9]) {
  case ON_UPPER:
    local_b28.m_backend.data._M_elems._32_8_ =
         *(undefined8 *)((this->m_oldUp).m_backend.data._M_elems + 8);
    local_b28.m_backend.data._M_elems._0_8_ = *(undefined8 *)(this->m_oldUp).m_backend.data._M_elems
    ;
    local_b28.m_backend.data._M_elems._8_8_ =
         *(undefined8 *)((this->m_oldUp).m_backend.data._M_elems + 2);
    local_b28.m_backend.data._M_elems._16_8_ =
         *(undefined8 *)((this->m_oldUp).m_backend.data._M_elems + 4);
    local_b28.m_backend.data._M_elems._24_8_ =
         *(undefined8 *)((this->m_oldUp).m_backend.data._M_elems + 6);
    local_b28.m_backend.exp = (this->m_oldUp).m_backend.exp;
    local_b28.m_backend.neg = (this->m_oldUp).m_backend.neg;
    local_b28.m_backend.fpclass = (this->m_oldUp).m_backend.fpclass;
    local_b28.m_backend.prec_elem = (this->m_oldUp).m_backend.prec_elem;
    pnVar4 = (x->val).
             super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    local_b68.m_backend.data._M_elems._32_8_ =
         *(undefined8 *)(pnVar4[iVar9].m_backend.data._M_elems + 8);
    pnVar8 = pnVar4 + iVar9;
    local_b68.m_backend.data._M_elems[0] = (pnVar8->m_backend).data._M_elems[0];
    local_b68.m_backend.data._M_elems[1] = (pnVar8->m_backend).data._M_elems[1];
    local_b68.m_backend.data._M_elems[2] = (pnVar8->m_backend).data._M_elems[2];
    local_b68.m_backend.data._M_elems[3] = (pnVar8->m_backend).data._M_elems[3];
    puVar1 = pnVar4[iVar9].m_backend.data._M_elems + 4;
    local_b68.m_backend.data._M_elems[4] = *puVar1;
    local_b68.m_backend.data._M_elems[5] = puVar1[1];
    local_b68.m_backend.data._M_elems[6] = puVar1[2];
    local_b68.m_backend.data._M_elems[7] = puVar1[3];
    local_b68.m_backend.exp = pnVar4[iVar9].m_backend.exp;
    local_b68.m_backend.neg = pnVar4[iVar9].m_backend.neg;
    local_b68.m_backend.fpclass = pnVar4[iVar9].m_backend.fpclass;
    local_b68.m_backend.prec_elem = pnVar4[iVar9].m_backend.prec_elem;
    (*(this->super_PostStep)._vptr_PostStep[6])(&local_3b0,this);
    bVar6 = EQrel<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                      (&local_b28,&local_b68,&local_3b0);
    pVVar15 = local_d20;
    if (bVar6) {
LAB_002a9005:
      iVar9 = this->m_i;
      rStatus->data[iVar9] = BASIC;
      pcVar10 = &(pVVar15->val).
                 super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                 ._M_impl.super__Vector_impl_data._M_start[iVar9].m_backend;
      goto LAB_002a902a;
    }
    cStatus->data[this->m_j] = BASIC;
    pcVar10 = &local_ba8;
    local_ba8.fpclass = cpp_dec_float_finite;
    local_ba8.prec_elem = 10;
    local_ba8.data._M_elems[0] = 0;
    local_ba8.data._M_elems[1] = 0;
    local_ba8.data._M_elems[2] = 0;
    local_ba8.data._M_elems[3] = 0;
    local_ba8.data._M_elems[4] = 0;
    local_ba8.data._M_elems[5] = 0;
    local_ba8.data._M_elems._24_5_ = 0;
    local_ba8.data._M_elems[7]._1_3_ = 0;
    local_ba8.data._M_elems._32_5_ = 0;
    local_ba8._37_8_ = 0;
    boost::multiprecision::default_ops::
    eval_divide_default<boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
              (pcVar10,&pnVar14->m_backend,&local_c58);
    iVar9 = this->m_j;
    pnVar4 = (x->val).
             super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    local_be8.m_backend.data._M_elems._32_8_ =
         *(undefined8 *)(pnVar4[iVar9].m_backend.data._M_elems + 8);
    pnVar14 = &local_be8;
    pnVar8 = pnVar4 + iVar9;
    local_be8.m_backend.data._M_elems[0] = (pnVar8->m_backend).data._M_elems[0];
    local_be8.m_backend.data._M_elems[1] = (pnVar8->m_backend).data._M_elems[1];
    local_be8.m_backend.data._M_elems[2] = (pnVar8->m_backend).data._M_elems[2];
    local_be8.m_backend.data._M_elems[3] = (pnVar8->m_backend).data._M_elems[3];
    puVar1 = pnVar4[iVar9].m_backend.data._M_elems + 4;
    local_be8.m_backend.data._M_elems[4] = *puVar1;
    local_be8.m_backend.data._M_elems[5] = puVar1[1];
    local_be8.m_backend.data._M_elems[6] = puVar1[2];
    local_be8.m_backend.data._M_elems[7] = puVar1[3];
    local_be8.m_backend.exp = pnVar4[iVar9].m_backend.exp;
    local_be8.m_backend.neg = pnVar4[iVar9].m_backend.neg;
    local_be8.m_backend.fpclass = pnVar4[iVar9].m_backend.fpclass;
    local_be8.m_backend.prec_elem = pnVar4[iVar9].m_backend.prec_elem;
    pp_Var7 = (this->super_PostStep)._vptr_PostStep;
    pnVar13 = &local_3e8;
    break;
  case ON_LOWER:
    local_a28.m_backend.data._M_elems._32_8_ =
         *(undefined8 *)((this->m_oldLo).m_backend.data._M_elems + 8);
    local_a28.m_backend.data._M_elems._0_8_ = *(undefined8 *)(this->m_oldLo).m_backend.data._M_elems
    ;
    local_a28.m_backend.data._M_elems._8_8_ =
         *(undefined8 *)((this->m_oldLo).m_backend.data._M_elems + 2);
    local_a28.m_backend.data._M_elems._16_8_ =
         *(undefined8 *)((this->m_oldLo).m_backend.data._M_elems + 4);
    local_a28.m_backend.data._M_elems._24_8_ =
         *(undefined8 *)((this->m_oldLo).m_backend.data._M_elems + 6);
    local_a28.m_backend.exp = (this->m_oldLo).m_backend.exp;
    local_a28.m_backend.neg = (this->m_oldLo).m_backend.neg;
    local_a28.m_backend.fpclass = (this->m_oldLo).m_backend.fpclass;
    local_a28.m_backend.prec_elem = (this->m_oldLo).m_backend.prec_elem;
    pnVar4 = (x->val).
             super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    local_a68.m_backend.data._M_elems._32_8_ =
         *(undefined8 *)(pnVar4[iVar9].m_backend.data._M_elems + 8);
    pnVar8 = pnVar4 + iVar9;
    local_a68.m_backend.data._M_elems[0] = (pnVar8->m_backend).data._M_elems[0];
    local_a68.m_backend.data._M_elems[1] = (pnVar8->m_backend).data._M_elems[1];
    local_a68.m_backend.data._M_elems[2] = (pnVar8->m_backend).data._M_elems[2];
    local_a68.m_backend.data._M_elems[3] = (pnVar8->m_backend).data._M_elems[3];
    puVar1 = pnVar4[iVar9].m_backend.data._M_elems + 4;
    local_a68.m_backend.data._M_elems[4] = *puVar1;
    local_a68.m_backend.data._M_elems[5] = puVar1[1];
    local_a68.m_backend.data._M_elems[6] = puVar1[2];
    local_a68.m_backend.data._M_elems[7] = puVar1[3];
    local_a68.m_backend.exp = pnVar4[iVar9].m_backend.exp;
    local_a68.m_backend.neg = pnVar4[iVar9].m_backend.neg;
    local_a68.m_backend.fpclass = pnVar4[iVar9].m_backend.fpclass;
    local_a68.m_backend.prec_elem = pnVar4[iVar9].m_backend.prec_elem;
    (*(this->super_PostStep)._vptr_PostStep[6])(&local_340,this);
    bVar6 = EQrel<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                      (&local_a28,&local_a68,&local_340);
    pVVar15 = local_d20;
    if (bVar6) goto LAB_002a9005;
    cStatus->data[this->m_j] = BASIC;
    pcVar10 = &local_aa8;
    local_aa8.fpclass = cpp_dec_float_finite;
    local_aa8.prec_elem = 10;
    local_aa8.data._M_elems[0] = 0;
    local_aa8.data._M_elems[1] = 0;
    local_aa8.data._M_elems[2] = 0;
    local_aa8.data._M_elems[3] = 0;
    local_aa8.data._M_elems[4] = 0;
    local_aa8.data._M_elems[5] = 0;
    local_aa8.data._M_elems._24_5_ = 0;
    local_aa8.data._M_elems[7]._1_3_ = 0;
    local_aa8.data._M_elems._32_5_ = 0;
    local_aa8._37_8_ = 0;
    boost::multiprecision::default_ops::
    eval_divide_default<boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
              (pcVar10,&pnVar14->m_backend,&local_c58);
    iVar9 = this->m_j;
    pnVar4 = (x->val).
             super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    local_ae8.m_backend.data._M_elems._32_8_ =
         *(undefined8 *)(pnVar4[iVar9].m_backend.data._M_elems + 8);
    pnVar14 = &local_ae8;
    pnVar8 = pnVar4 + iVar9;
    local_ae8.m_backend.data._M_elems[0] = (pnVar8->m_backend).data._M_elems[0];
    local_ae8.m_backend.data._M_elems[1] = (pnVar8->m_backend).data._M_elems[1];
    local_ae8.m_backend.data._M_elems[2] = (pnVar8->m_backend).data._M_elems[2];
    local_ae8.m_backend.data._M_elems[3] = (pnVar8->m_backend).data._M_elems[3];
    puVar1 = pnVar4[iVar9].m_backend.data._M_elems + 4;
    local_ae8.m_backend.data._M_elems[4] = *puVar1;
    local_ae8.m_backend.data._M_elems[5] = puVar1[1];
    local_ae8.m_backend.data._M_elems[6] = puVar1[2];
    local_ae8.m_backend.data._M_elems[7] = puVar1[3];
    local_ae8.m_backend.exp = pnVar4[iVar9].m_backend.exp;
    local_ae8.m_backend.neg = pnVar4[iVar9].m_backend.neg;
    local_ae8.m_backend.fpclass = pnVar4[iVar9].m_backend.fpclass;
    local_ae8.m_backend.prec_elem = pnVar4[iVar9].m_backend.prec_elem;
    pp_Var7 = (this->super_PostStep)._vptr_PostStep;
    pnVar13 = &local_378;
    break;
  case FIXED:
    pnVar13 = &this->m_oldLo;
    tVar5 = boost::multiprecision::operator<=
                      ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                        *)&local_cd8,pnVar13);
    pVVar15 = local_d20;
    if ((tVar5) &&
       (tVar5 = boost::multiprecision::operator>=
                          ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                            *)&local_c98,&this->m_oldUp), tVar5)) {
LAB_002a9623:
      iVar9 = this->m_i;
      rStatus->data[iVar9] = BASIC;
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator=
                (&(pVVar15->val).
                  super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                  ._M_impl.super__Vector_impl_data._M_start[iVar9].m_backend,
                 &(this->m_row_obj).m_backend);
      return;
    }
    local_428.m_backend.data._M_elems[9]._1_3_ = local_cd8.data._M_elems[9]._1_3_;
    local_428.m_backend.data._M_elems._32_5_ = local_cd8.data._M_elems._32_5_;
    local_428.m_backend.data._M_elems[7]._1_3_ = local_cd8.data._M_elems[7]._1_3_;
    local_428.m_backend.data._M_elems._24_5_ = local_cd8.data._M_elems._24_5_;
    local_428.m_backend.data._M_elems[4] = local_cd8.data._M_elems[4];
    local_428.m_backend.data._M_elems[5] = local_cd8.data._M_elems[5];
    local_428.m_backend.data._M_elems[0] = local_cd8.data._M_elems[0];
    local_428.m_backend.data._M_elems[1] = local_cd8.data._M_elems[1];
    local_428.m_backend.data._M_elems[2] = local_cd8.data._M_elems[2];
    local_428.m_backend.data._M_elems[3] = local_cd8.data._M_elems[3];
    local_428.m_backend.exp = local_cd8.exp;
    local_428.m_backend.neg = local_cd8.neg;
    local_428.m_backend.fpclass = local_cd8.fpclass;
    local_428.m_backend.prec_elem = local_cd8.prec_elem;
    local_468.m_backend.data._M_elems[0] = local_c98.data._M_elems[0];
    local_468.m_backend.data._M_elems[1] = local_c98.data._M_elems[1];
    local_468.m_backend.data._M_elems[2] = local_c98.data._M_elems[2];
    local_468.m_backend.data._M_elems[3] = local_c98.data._M_elems[3];
    local_468.m_backend.data._M_elems[4] = local_c98.data._M_elems[4];
    local_468.m_backend.data._M_elems[5] = local_c98.data._M_elems[5];
    local_468.m_backend.data._M_elems[6] = local_c98.data._M_elems[6];
    local_468.m_backend.data._M_elems[7] = local_c98.data._M_elems[7];
    local_468.m_backend.data._M_elems[9]._1_3_ = local_c98.data._M_elems[9]._1_3_;
    local_468.m_backend.data._M_elems._32_5_ = local_c98.data._M_elems._32_5_;
    local_468.m_backend.exp = local_c98.exp;
    local_468.m_backend.neg = local_c98.neg;
    local_468.m_backend.fpclass = local_c98.fpclass;
    local_468.m_backend.prec_elem = local_c98.prec_elem;
    (*(this->super_PostStep)._vptr_PostStep[6])(&local_68,this);
    bVar6 = EQrel<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                      (&local_428,&local_468,&local_68);
    if (bVar6) {
      local_4a8.m_backend.data._M_elems._32_8_ =
           *(undefined8 *)((this->m_oldLo).m_backend.data._M_elems + 8);
      local_4a8.m_backend.data._M_elems._0_8_ = *(undefined8 *)(pnVar13->m_backend).data._M_elems;
      local_4a8.m_backend.data._M_elems._8_8_ =
           *(undefined8 *)((this->m_oldLo).m_backend.data._M_elems + 2);
      local_4a8.m_backend.data._M_elems._16_8_ =
           *(undefined8 *)((this->m_oldLo).m_backend.data._M_elems + 4);
      local_4a8.m_backend.data._M_elems._24_8_ =
           *(undefined8 *)((this->m_oldLo).m_backend.data._M_elems + 6);
      local_4a8.m_backend.exp = (this->m_oldLo).m_backend.exp;
      local_4a8.m_backend.neg = (this->m_oldLo).m_backend.neg;
      local_4a8.m_backend.fpclass = (this->m_oldLo).m_backend.fpclass;
      local_4a8.m_backend.prec_elem = (this->m_oldLo).m_backend.prec_elem;
      local_4e8.m_backend.data._M_elems[0] = (this->m_oldUp).m_backend.data._M_elems[0];
      local_4e8.m_backend.data._M_elems[1] = (this->m_oldUp).m_backend.data._M_elems[1];
      local_4e8.m_backend.data._M_elems[2] = (this->m_oldUp).m_backend.data._M_elems[2];
      local_4e8.m_backend.data._M_elems[3] = (this->m_oldUp).m_backend.data._M_elems[3];
      local_4e8.m_backend.data._M_elems[4] = (this->m_oldUp).m_backend.data._M_elems[4];
      local_4e8.m_backend.data._M_elems[5] = (this->m_oldUp).m_backend.data._M_elems[5];
      local_4e8.m_backend.data._M_elems[6] = (this->m_oldUp).m_backend.data._M_elems[6];
      local_4e8.m_backend.data._M_elems[7] = (this->m_oldUp).m_backend.data._M_elems[7];
      local_4e8.m_backend.data._M_elems._32_8_ =
           *(undefined8 *)((this->m_oldUp).m_backend.data._M_elems + 8);
      local_4e8.m_backend.exp = (this->m_oldUp).m_backend.exp;
      local_4e8.m_backend.neg = (this->m_oldUp).m_backend.neg;
      local_4e8.m_backend.fpclass = (this->m_oldUp).m_backend.fpclass;
      local_4e8.m_backend.prec_elem = (this->m_oldUp).m_backend.prec_elem;
      (*(this->super_PostStep)._vptr_PostStep[6])(&local_a0,this);
      bVar6 = EQrel<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                        (&local_4a8,&local_4e8,&local_a0);
      if (bVar6) goto LAB_002a9623;
      local_528.m_backend.data._M_elems._32_8_ =
           *(undefined8 *)((this->m_oldLo).m_backend.data._M_elems + 8);
      local_528.m_backend.data._M_elems._0_8_ = *(undefined8 *)(pnVar13->m_backend).data._M_elems;
      local_528.m_backend.data._M_elems._8_8_ =
           *(undefined8 *)((this->m_oldLo).m_backend.data._M_elems + 2);
      local_528.m_backend.data._M_elems._16_8_ =
           *(undefined8 *)((this->m_oldLo).m_backend.data._M_elems + 4);
      local_528.m_backend.data._M_elems._24_8_ =
           *(undefined8 *)((this->m_oldLo).m_backend.data._M_elems + 6);
      local_528.m_backend.exp = (this->m_oldLo).m_backend.exp;
      local_528.m_backend.neg = (this->m_oldLo).m_backend.neg;
      local_528.m_backend.fpclass = (this->m_oldLo).m_backend.fpclass;
      local_528.m_backend.prec_elem = (this->m_oldLo).m_backend.prec_elem;
      iVar9 = this->m_j;
      pnVar4 = (x->val).
               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      local_568.m_backend.data._M_elems._32_8_ =
           *(undefined8 *)(pnVar4[iVar9].m_backend.data._M_elems + 8);
      pnVar8 = pnVar4 + iVar9;
      local_568.m_backend.data._M_elems[0] = (pnVar8->m_backend).data._M_elems[0];
      local_568.m_backend.data._M_elems[1] = (pnVar8->m_backend).data._M_elems[1];
      local_568.m_backend.data._M_elems[2] = (pnVar8->m_backend).data._M_elems[2];
      local_568.m_backend.data._M_elems[3] = (pnVar8->m_backend).data._M_elems[3];
      puVar1 = pnVar4[iVar9].m_backend.data._M_elems + 4;
      local_568.m_backend.data._M_elems[4] = *puVar1;
      local_568.m_backend.data._M_elems[5] = puVar1[1];
      local_568.m_backend.data._M_elems[6] = puVar1[2];
      local_568.m_backend.data._M_elems[7] = puVar1[3];
      local_568.m_backend.exp = pnVar4[iVar9].m_backend.exp;
      local_568.m_backend.neg = pnVar4[iVar9].m_backend.neg;
      local_568.m_backend.fpclass = pnVar4[iVar9].m_backend.fpclass;
      local_568.m_backend.prec_elem = pnVar4[iVar9].m_backend.prec_elem;
      (*(this->super_PostStep)._vptr_PostStep[6])(&local_d8,this);
      bVar6 = EQrel<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                        (&local_528,&local_568,&local_d8);
      if (!bVar6) {
LAB_002a8bd2:
        local_5a8.m_backend.data._M_elems._32_8_ =
             *(undefined8 *)((this->m_oldUp).m_backend.data._M_elems + 8);
        local_5a8.m_backend.data._M_elems._0_8_ =
             *(undefined8 *)(this->m_oldUp).m_backend.data._M_elems;
        local_5a8.m_backend.data._M_elems._8_8_ =
             *(undefined8 *)((this->m_oldUp).m_backend.data._M_elems + 2);
        local_5a8.m_backend.data._M_elems._16_8_ =
             *(undefined8 *)((this->m_oldUp).m_backend.data._M_elems + 4);
        local_5a8.m_backend.data._M_elems._24_8_ =
             *(undefined8 *)((this->m_oldUp).m_backend.data._M_elems + 6);
        local_5a8.m_backend.exp = (this->m_oldUp).m_backend.exp;
        local_5a8.m_backend.neg = (this->m_oldUp).m_backend.neg;
        local_5a8.m_backend.fpclass = (this->m_oldUp).m_backend.fpclass;
        local_5a8.m_backend.prec_elem = (this->m_oldUp).m_backend.prec_elem;
        iVar9 = this->m_j;
        pnVar4 = (x->val).
                 super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        local_5e8.m_backend.data._M_elems._32_8_ =
             *(undefined8 *)(pnVar4[iVar9].m_backend.data._M_elems + 8);
        pnVar8 = pnVar4 + iVar9;
        local_5e8.m_backend.data._M_elems[0] = (pnVar8->m_backend).data._M_elems[0];
        local_5e8.m_backend.data._M_elems[1] = (pnVar8->m_backend).data._M_elems[1];
        local_5e8.m_backend.data._M_elems[2] = (pnVar8->m_backend).data._M_elems[2];
        local_5e8.m_backend.data._M_elems[3] = (pnVar8->m_backend).data._M_elems[3];
        puVar1 = pnVar4[iVar9].m_backend.data._M_elems + 4;
        local_5e8.m_backend.data._M_elems[4] = *puVar1;
        local_5e8.m_backend.data._M_elems[5] = puVar1[1];
        local_5e8.m_backend.data._M_elems[6] = puVar1[2];
        local_5e8.m_backend.data._M_elems[7] = puVar1[3];
        local_5e8.m_backend.exp = pnVar4[iVar9].m_backend.exp;
        local_5e8.m_backend.neg = pnVar4[iVar9].m_backend.neg;
        local_5e8.m_backend.fpclass = pnVar4[iVar9].m_backend.fpclass;
        local_5e8.m_backend.prec_elem = pnVar4[iVar9].m_backend.prec_elem;
        (*(this->super_PostStep)._vptr_PostStep[6])(&local_110,this);
        bVar6 = EQrel<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                          (&local_5a8,&local_5e8,&local_110);
        if (bVar6) {
          iVar9 = this->m_j;
          pnVar8 = (r->val).
                   super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          (*(this->super_PostStep)._vptr_PostStep[6])(&local_148,this);
          tVar5 = boost::multiprecision::operator>=(pnVar8 + iVar9,&local_148);
          if (tVar5) goto LAB_002a9655;
        }
        local_628.m_backend.data._M_elems._32_8_ =
             *(undefined8 *)((this->m_oldLo).m_backend.data._M_elems + 8);
        local_628.m_backend.data._M_elems._0_8_ = *(undefined8 *)(pnVar13->m_backend).data._M_elems;
        local_628.m_backend.data._M_elems._8_8_ =
             *(undefined8 *)((this->m_oldLo).m_backend.data._M_elems + 2);
        local_628.m_backend.data._M_elems._16_8_ =
             *(undefined8 *)((this->m_oldLo).m_backend.data._M_elems + 4);
        local_628.m_backend.data._M_elems._24_8_ =
             *(undefined8 *)((this->m_oldLo).m_backend.data._M_elems + 6);
        local_628.m_backend.exp = (this->m_oldLo).m_backend.exp;
        local_628.m_backend.neg = (this->m_oldLo).m_backend.neg;
        local_628.m_backend.fpclass = (this->m_oldLo).m_backend.fpclass;
        local_628.m_backend.prec_elem = (this->m_oldLo).m_backend.prec_elem;
        iVar9 = this->m_j;
        pnVar4 = (x->val).
                 super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        local_668.m_backend.data._M_elems._32_8_ =
             *(undefined8 *)(pnVar4[iVar9].m_backend.data._M_elems + 8);
        pnVar8 = pnVar4 + iVar9;
        local_668.m_backend.data._M_elems[0] = (pnVar8->m_backend).data._M_elems[0];
        local_668.m_backend.data._M_elems[1] = (pnVar8->m_backend).data._M_elems[1];
        local_668.m_backend.data._M_elems[2] = (pnVar8->m_backend).data._M_elems[2];
        local_668.m_backend.data._M_elems[3] = (pnVar8->m_backend).data._M_elems[3];
        puVar1 = pnVar4[iVar9].m_backend.data._M_elems + 4;
        local_668.m_backend.data._M_elems[4] = *puVar1;
        local_668.m_backend.data._M_elems[5] = puVar1[1];
        local_668.m_backend.data._M_elems[6] = puVar1[2];
        local_668.m_backend.data._M_elems[7] = puVar1[3];
        local_668.m_backend.exp = pnVar4[iVar9].m_backend.exp;
        local_668.m_backend.neg = pnVar4[iVar9].m_backend.neg;
        local_668.m_backend.fpclass = pnVar4[iVar9].m_backend.fpclass;
        local_668.m_backend.prec_elem = pnVar4[iVar9].m_backend.prec_elem;
        (*(this->super_PostStep)._vptr_PostStep[6])(&local_180,this);
        bVar6 = EQrel<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                          (&local_628,&local_668,&local_180);
        if (!bVar6) {
          local_6a8.m_backend.data._M_elems._32_8_ =
               *(undefined8 *)((this->m_oldUp).m_backend.data._M_elems + 8);
          local_6a8.m_backend.data._M_elems._0_8_ =
               *(undefined8 *)(this->m_oldUp).m_backend.data._M_elems;
          local_6a8.m_backend.data._M_elems._8_8_ =
               *(undefined8 *)((this->m_oldUp).m_backend.data._M_elems + 2);
          local_6a8.m_backend.data._M_elems._16_8_ =
               *(undefined8 *)((this->m_oldUp).m_backend.data._M_elems + 4);
          local_6a8.m_backend.data._M_elems._24_8_ =
               *(undefined8 *)((this->m_oldUp).m_backend.data._M_elems + 6);
          local_6a8.m_backend.exp = (this->m_oldUp).m_backend.exp;
          local_6a8.m_backend.neg = (this->m_oldUp).m_backend.neg;
          local_6a8.m_backend.fpclass = (this->m_oldUp).m_backend.fpclass;
          local_6a8.m_backend.prec_elem = (this->m_oldUp).m_backend.prec_elem;
          iVar9 = this->m_j;
          pnVar4 = (x->val).
                   super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          local_6e8.m_backend.data._M_elems._32_8_ =
               *(undefined8 *)(pnVar4[iVar9].m_backend.data._M_elems + 8);
          pnVar8 = pnVar4 + iVar9;
          local_6e8.m_backend.data._M_elems[0] = (pnVar8->m_backend).data._M_elems[0];
          local_6e8.m_backend.data._M_elems[1] = (pnVar8->m_backend).data._M_elems[1];
          local_6e8.m_backend.data._M_elems[2] = (pnVar8->m_backend).data._M_elems[2];
          local_6e8.m_backend.data._M_elems[3] = (pnVar8->m_backend).data._M_elems[3];
          puVar1 = pnVar4[iVar9].m_backend.data._M_elems + 4;
          local_6e8.m_backend.data._M_elems[4] = *puVar1;
          local_6e8.m_backend.data._M_elems[5] = puVar1[1];
          local_6e8.m_backend.data._M_elems[6] = puVar1[2];
          local_6e8.m_backend.data._M_elems[7] = puVar1[3];
          local_6e8.m_backend.exp = pnVar4[iVar9].m_backend.exp;
          local_6e8.m_backend.neg = pnVar4[iVar9].m_backend.neg;
          local_6e8.m_backend.fpclass = pnVar4[iVar9].m_backend.fpclass;
          local_6e8.m_backend.prec_elem = pnVar4[iVar9].m_backend.prec_elem;
          (*(this->super_PostStep)._vptr_PostStep[6])(&local_1b8,this);
          bVar6 = EQrel<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                            (&local_6a8,&local_6e8,&local_1b8);
          if (!bVar6) goto LAB_002a9655;
        }
        local_7a8.m_backend.data._M_elems._32_8_ =
             *(undefined8 *)((this->m_oldLo).m_backend.data._M_elems + 8);
        local_7a8.m_backend.data._M_elems._0_8_ = *(undefined8 *)(pnVar13->m_backend).data._M_elems;
        local_7a8.m_backend.data._M_elems._8_8_ =
             *(undefined8 *)((this->m_oldLo).m_backend.data._M_elems + 2);
        local_7a8.m_backend.data._M_elems._16_8_ =
             *(undefined8 *)((this->m_oldLo).m_backend.data._M_elems + 4);
        local_7a8.m_backend.data._M_elems._24_8_ =
             *(undefined8 *)((this->m_oldLo).m_backend.data._M_elems + 6);
        local_7a8.m_backend.exp = (this->m_oldLo).m_backend.exp;
        local_7a8.m_backend.neg = (this->m_oldLo).m_backend.neg;
        local_7a8.m_backend.fpclass = (this->m_oldLo).m_backend.fpclass;
        local_7a8.m_backend.prec_elem = (this->m_oldLo).m_backend.prec_elem;
        iVar9 = this->m_j;
        pnVar4 = (x->val).
                 super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        local_7e8.m_backend.data._M_elems._32_8_ =
             *(undefined8 *)(pnVar4[iVar9].m_backend.data._M_elems + 8);
        pnVar8 = pnVar4 + iVar9;
        local_7e8.m_backend.data._M_elems[0] = (pnVar8->m_backend).data._M_elems[0];
        local_7e8.m_backend.data._M_elems[1] = (pnVar8->m_backend).data._M_elems[1];
        local_7e8.m_backend.data._M_elems[2] = (pnVar8->m_backend).data._M_elems[2];
        local_7e8.m_backend.data._M_elems[3] = (pnVar8->m_backend).data._M_elems[3];
        puVar1 = pnVar4[iVar9].m_backend.data._M_elems + 4;
        local_7e8.m_backend.data._M_elems[4] = *puVar1;
        local_7e8.m_backend.data._M_elems[5] = puVar1[1];
        local_7e8.m_backend.data._M_elems[6] = puVar1[2];
        local_7e8.m_backend.data._M_elems[7] = puVar1[3];
        local_7e8.m_backend.exp = pnVar4[iVar9].m_backend.exp;
        local_7e8.m_backend.neg = pnVar4[iVar9].m_backend.neg;
        local_7e8.m_backend.fpclass = pnVar4[iVar9].m_backend.fpclass;
        local_7e8.m_backend.prec_elem = pnVar4[iVar9].m_backend.prec_elem;
        (*(this->super_PostStep)._vptr_PostStep[6])(&local_228,this);
        bVar6 = EQrel<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                          (&local_7a8,&local_7e8,&local_228);
        cStatus->data[this->m_j] = (uint)bVar6;
        goto LAB_002a9005;
      }
      iVar9 = this->m_j;
      pnVar8 = (r->val).
               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      (*(this->super_PostStep)._vptr_PostStep[6])(&local_c20,this);
      local_d18.data._M_elems[0] = (undefined4)local_c20;
      local_d18.data._M_elems[1] = local_c20._4_4_;
      uVar2 = local_d18.data._M_elems._0_8_;
      local_d18.data._M_elems[2] = auStack_c18[0];
      local_d18.data._M_elems[3] = auStack_c18[1];
      local_d18.data._M_elems._32_5_ = SUB85(local_c10._16_8_,0);
      local_d18.data._M_elems[9]._1_3_ = SUB83(local_c10._16_8_,5);
      local_d18.data._M_elems[4] = local_c10[0];
      local_d18.data._M_elems[5] = local_c10[1];
      local_d18.data._M_elems._24_5_ = SUB85(local_c10._8_8_,0);
      local_d18.data._M_elems[7]._1_3_ = SUB83(local_c10._8_8_,5);
      local_d18.exp = local_bf8;
      local_d18.neg = (bool)local_bf4;
      local_d18.fpclass = local_bf0;
      local_d18.prec_elem = iStack_bec;
      local_d18.data._M_elems[0] = (uint)local_c20;
      if ((fpclass_type)_local_bf0 != cpp_dec_float_finite || local_d18.data._M_elems[0] != 0) {
        local_d18.neg = (bool)(local_bf4 ^ 1);
      }
      local_d18.data._M_elems._0_8_ = uVar2;
      tVar5 = boost::multiprecision::operator<=
                        (pnVar8 + iVar9,
                         (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                          *)&local_d18);
      if (!tVar5) goto LAB_002a8bd2;
LAB_002a9655:
      local_728.m_backend.data._M_elems._32_8_ =
           *(undefined8 *)((this->m_lhs).m_backend.data._M_elems + 8);
      local_728.m_backend.data._M_elems._0_8_ = *(undefined8 *)(this->m_lhs).m_backend.data._M_elems
      ;
      local_728.m_backend.data._M_elems._8_8_ =
           *(undefined8 *)((this->m_lhs).m_backend.data._M_elems + 2);
      local_728.m_backend.data._M_elems._16_8_ =
           *(undefined8 *)((this->m_lhs).m_backend.data._M_elems + 4);
      local_728.m_backend.data._M_elems._24_8_ =
           *(undefined8 *)((this->m_lhs).m_backend.data._M_elems + 6);
      local_728.m_backend.exp = (this->m_lhs).m_backend.exp;
      local_728.m_backend.neg = (this->m_lhs).m_backend.neg;
      local_728.m_backend.fpclass = (this->m_lhs).m_backend.fpclass;
      local_728.m_backend.prec_elem = (this->m_lhs).m_backend.prec_elem;
      local_768.fpclass = cpp_dec_float_finite;
      local_768.prec_elem = 10;
      local_768.data._M_elems[0] = 0;
      local_768.data._M_elems[1] = 0;
      local_768.data._M_elems[2] = 0;
      local_768.data._M_elems[3] = 0;
      local_768.data._M_elems[4] = 0;
      local_768.data._M_elems[5] = 0;
      local_768.data._M_elems._24_5_ = 0;
      local_768.data._M_elems[7]._1_3_ = 0;
      local_768.data._M_elems._32_5_ = 0;
      local_768._37_8_ = 0;
      boost::multiprecision::default_ops::
      eval_multiply_default<boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                (&local_768,
                 &(x->val).
                  super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                  ._M_impl.super__Vector_impl_data._M_start[this->m_j].m_backend,&local_c58);
      (*(this->super_PostStep)._vptr_PostStep[6])(&local_1f0,this);
      bVar6 = EQrel<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                        (&local_728,
                         (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                          *)&local_768,&local_1f0);
      rStatus->data[this->m_i] = (uint)bVar6;
      cStatus->data[this->m_j] = BASIC;
      goto LAB_002a9147;
    }
    local_828.m_backend.data._M_elems[9]._1_3_ = local_cd8.data._M_elems[9]._1_3_;
    local_828.m_backend.data._M_elems._32_5_ = local_cd8.data._M_elems._32_5_;
    local_828.m_backend.data._M_elems[7]._1_3_ = local_cd8.data._M_elems[7]._1_3_;
    local_828.m_backend.data._M_elems._24_5_ = local_cd8.data._M_elems._24_5_;
    local_828.m_backend.data._M_elems[4] = local_cd8.data._M_elems[4];
    local_828.m_backend.data._M_elems[5] = local_cd8.data._M_elems[5];
    local_828.m_backend.data._M_elems[0] = local_cd8.data._M_elems[0];
    local_828.m_backend.data._M_elems[1] = local_cd8.data._M_elems[1];
    local_828.m_backend.data._M_elems[2] = local_cd8.data._M_elems[2];
    local_828.m_backend.data._M_elems[3] = local_cd8.data._M_elems[3];
    local_828.m_backend.exp = local_cd8.exp;
    local_828.m_backend.neg = local_cd8.neg;
    local_828.m_backend.fpclass = local_cd8.fpclass;
    local_828.m_backend.prec_elem = local_cd8.prec_elem;
    local_868.m_backend.data._M_elems[0] = (this->m_oldUp).m_backend.data._M_elems[0];
    local_868.m_backend.data._M_elems[1] = (this->m_oldUp).m_backend.data._M_elems[1];
    local_868.m_backend.data._M_elems[2] = (this->m_oldUp).m_backend.data._M_elems[2];
    local_868.m_backend.data._M_elems[3] = (this->m_oldUp).m_backend.data._M_elems[3];
    local_868.m_backend.data._M_elems[4] = (this->m_oldUp).m_backend.data._M_elems[4];
    local_868.m_backend.data._M_elems[5] = (this->m_oldUp).m_backend.data._M_elems[5];
    local_868.m_backend.data._M_elems[6] = (this->m_oldUp).m_backend.data._M_elems[6];
    local_868.m_backend.data._M_elems[7] = (this->m_oldUp).m_backend.data._M_elems[7];
    local_868.m_backend.data._M_elems._32_8_ =
         *(undefined8 *)((this->m_oldUp).m_backend.data._M_elems + 8);
    local_868.m_backend.exp = (this->m_oldUp).m_backend.exp;
    local_868.m_backend.neg = (this->m_oldUp).m_backend.neg;
    local_868.m_backend.fpclass = (this->m_oldUp).m_backend.fpclass;
    local_868.m_backend.prec_elem = (this->m_oldUp).m_backend.prec_elem;
    (*(this->super_PostStep)._vptr_PostStep[6])(&local_260,this);
    bVar6 = EQrel<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                      (&local_828,&local_868,&local_260);
    if (bVar6) {
      iVar9 = this->m_j;
      pnVar8 = (r->val).
               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      (*(this->super_PostStep)._vptr_PostStep[6])(&local_d18,this);
      tVar5 = boost::multiprecision::operator>=
                        (pnVar8 + iVar9,
                         (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                          *)&local_d18);
      if (!tVar5) {
        cStatus->data[this->m_j] = ON_UPPER;
LAB_002a974c:
        iVar9 = this->m_i;
        rStatus->data[iVar9] = BASIC;
        boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator=
                  (&(pVVar15->val).
                    super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                    ._M_impl.super__Vector_impl_data._M_start[iVar9].m_backend,
                   &(this->m_row_obj).m_backend);
        iVar9 = this->m_j;
        pnVar8 = (r->val).
                 super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        goto LAB_002a903a;
      }
      pcVar10 = &local_8a8;
      local_8a8.fpclass = cpp_dec_float_finite;
      local_8a8.prec_elem = 10;
      local_8a8.data._M_elems[0] = 0;
      local_8a8.data._M_elems[1] = 0;
      local_8a8.data._M_elems[2] = 0;
      local_8a8.data._M_elems[3] = 0;
      local_8a8.data._M_elems[4] = 0;
      local_8a8.data._M_elems[5] = 0;
      local_8a8.data._M_elems._24_5_ = 0;
      local_8a8.data._M_elems[7]._1_3_ = 0;
      local_8a8.data._M_elems._32_5_ = 0;
      local_8a8._37_8_ = 0;
      boost::multiprecision::default_ops::
      eval_divide_default<boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                (pcVar10,&pnVar14->m_backend,&local_c58);
      iVar9 = this->m_j;
      pnVar4 = (x->val).
               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      local_8e8.m_backend.data._M_elems._32_8_ =
           *(undefined8 *)(pnVar4[iVar9].m_backend.data._M_elems + 8);
      pnVar14 = &local_8e8;
      pnVar8 = pnVar4 + iVar9;
      local_8e8.m_backend.data._M_elems[0] = (pnVar8->m_backend).data._M_elems[0];
      local_8e8.m_backend.data._M_elems[1] = (pnVar8->m_backend).data._M_elems[1];
      local_8e8.m_backend.data._M_elems[2] = (pnVar8->m_backend).data._M_elems[2];
      local_8e8.m_backend.data._M_elems[3] = (pnVar8->m_backend).data._M_elems[3];
      puVar1 = pnVar4[iVar9].m_backend.data._M_elems + 4;
      local_8e8.m_backend.data._M_elems[4] = *puVar1;
      local_8e8.m_backend.data._M_elems[5] = puVar1[1];
      local_8e8.m_backend.data._M_elems[6] = puVar1[2];
      local_8e8.m_backend.data._M_elems[7] = puVar1[3];
      local_8e8.m_backend.exp = pnVar4[iVar9].m_backend.exp;
      local_8e8.m_backend.neg = pnVar4[iVar9].m_backend.neg;
      local_8e8.m_backend.fpclass = pnVar4[iVar9].m_backend.fpclass;
      local_8e8.m_backend.prec_elem = pnVar4[iVar9].m_backend.prec_elem;
      pp_Var7 = (this->super_PostStep)._vptr_PostStep;
      pnVar13 = &local_298;
    }
    else {
      local_928.m_backend.data._M_elems[9]._1_3_ = local_c98.data._M_elems[9]._1_3_;
      local_928.m_backend.data._M_elems._32_5_ = local_c98.data._M_elems._32_5_;
      local_928.m_backend.data._M_elems[7] = local_c98.data._M_elems[7];
      local_928.m_backend.data._M_elems[6] = local_c98.data._M_elems[6];
      local_928.m_backend.data._M_elems[4] = local_c98.data._M_elems[4];
      local_928.m_backend.data._M_elems[5] = local_c98.data._M_elems[5];
      local_928.m_backend.data._M_elems[0] = local_c98.data._M_elems[0];
      local_928.m_backend.data._M_elems[1] = local_c98.data._M_elems[1];
      local_928.m_backend.data._M_elems[2] = local_c98.data._M_elems[2];
      local_928.m_backend.data._M_elems[3] = local_c98.data._M_elems[3];
      local_928.m_backend.exp = local_c98.exp;
      local_928.m_backend.neg = local_c98.neg;
      local_928.m_backend.fpclass = local_c98.fpclass;
      local_928.m_backend.prec_elem = local_c98.prec_elem;
      local_968.m_backend.data._M_elems[0] = (pnVar13->m_backend).data._M_elems[0];
      local_968.m_backend.data._M_elems[1] = (this->m_oldLo).m_backend.data._M_elems[1];
      local_968.m_backend.data._M_elems[2] = (this->m_oldLo).m_backend.data._M_elems[2];
      local_968.m_backend.data._M_elems[3] = (this->m_oldLo).m_backend.data._M_elems[3];
      local_968.m_backend.data._M_elems[4] = (this->m_oldLo).m_backend.data._M_elems[4];
      local_968.m_backend.data._M_elems[5] = (this->m_oldLo).m_backend.data._M_elems[5];
      local_968.m_backend.data._M_elems[6] = (this->m_oldLo).m_backend.data._M_elems[6];
      local_968.m_backend.data._M_elems[7] = (this->m_oldLo).m_backend.data._M_elems[7];
      local_968.m_backend.data._M_elems._32_8_ =
           *(undefined8 *)((this->m_oldLo).m_backend.data._M_elems + 8);
      local_968.m_backend.exp = (this->m_oldLo).m_backend.exp;
      local_968.m_backend.neg = (this->m_oldLo).m_backend.neg;
      local_968.m_backend.fpclass = (this->m_oldLo).m_backend.fpclass;
      local_968.m_backend.prec_elem = (this->m_oldLo).m_backend.prec_elem;
      (*(this->super_PostStep)._vptr_PostStep[6])(&local_2d0,this);
      bVar6 = EQrel<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                        (&local_928,&local_968,&local_2d0);
      if (!bVar6) goto LAB_002a9623;
      iVar9 = this->m_j;
      pnVar8 = (r->val).
               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      (*(this->super_PostStep)._vptr_PostStep[6])(&local_c20,this);
      local_d18.data._M_elems[0] = (undefined4)local_c20;
      local_d18.data._M_elems[1] = local_c20._4_4_;
      uVar2 = local_d18.data._M_elems._0_8_;
      local_d18.data._M_elems[2] = auStack_c18[0];
      local_d18.data._M_elems[3] = auStack_c18[1];
      local_d18.data._M_elems._32_5_ = SUB85(local_c10._16_8_,0);
      local_d18.data._M_elems[9]._1_3_ = SUB83(local_c10._16_8_,5);
      local_d18.data._M_elems[4] = local_c10[0];
      local_d18.data._M_elems[5] = local_c10[1];
      local_d18.data._M_elems._24_5_ = SUB85(local_c10._8_8_,0);
      local_d18.data._M_elems[7]._1_3_ = SUB83(local_c10._8_8_,5);
      local_d18.exp = local_bf8;
      local_d18.neg = (bool)local_bf4;
      local_d18.fpclass = local_bf0;
      local_d18.prec_elem = iStack_bec;
      local_d18.data._M_elems[0] = (uint)local_c20;
      if ((fpclass_type)_local_bf0 != cpp_dec_float_finite || local_d18.data._M_elems[0] != 0) {
        local_d18.neg = (bool)(local_bf4 ^ 1);
      }
      local_d18.data._M_elems._0_8_ = uVar2;
      tVar5 = boost::multiprecision::operator<=
                        (pnVar8 + iVar9,
                         (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                          *)&local_d18);
      if (!tVar5) {
        cStatus->data[this->m_j] = ON_LOWER;
        goto LAB_002a974c;
      }
      pcVar10 = &local_9a8;
      local_9a8.fpclass = cpp_dec_float_finite;
      local_9a8.prec_elem = 10;
      local_9a8.data._M_elems[0] = 0;
      local_9a8.data._M_elems[1] = 0;
      local_9a8.data._M_elems[2] = 0;
      local_9a8.data._M_elems[3] = 0;
      local_9a8.data._M_elems[4] = 0;
      local_9a8.data._M_elems[5] = 0;
      local_9a8.data._M_elems._24_5_ = 0;
      local_9a8.data._M_elems[7]._1_3_ = 0;
      local_9a8.data._M_elems._32_5_ = 0;
      local_9a8._37_8_ = 0;
      boost::multiprecision::default_ops::
      eval_divide_default<boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                (pcVar10,&pnVar14->m_backend,&local_c58);
      iVar9 = this->m_j;
      pnVar4 = (x->val).
               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      local_9e8.m_backend.data._M_elems._32_8_ =
           *(undefined8 *)(pnVar4[iVar9].m_backend.data._M_elems + 8);
      pnVar14 = &local_9e8;
      pnVar8 = pnVar4 + iVar9;
      local_9e8.m_backend.data._M_elems[0] = (pnVar8->m_backend).data._M_elems[0];
      local_9e8.m_backend.data._M_elems[1] = (pnVar8->m_backend).data._M_elems[1];
      local_9e8.m_backend.data._M_elems[2] = (pnVar8->m_backend).data._M_elems[2];
      local_9e8.m_backend.data._M_elems[3] = (pnVar8->m_backend).data._M_elems[3];
      puVar1 = pnVar4[iVar9].m_backend.data._M_elems + 4;
      local_9e8.m_backend.data._M_elems[4] = *puVar1;
      local_9e8.m_backend.data._M_elems[5] = puVar1[1];
      local_9e8.m_backend.data._M_elems[6] = puVar1[2];
      local_9e8.m_backend.data._M_elems[7] = puVar1[3];
      local_9e8.m_backend.exp = pnVar4[iVar9].m_backend.exp;
      local_9e8.m_backend.neg = pnVar4[iVar9].m_backend.neg;
      local_9e8.m_backend.fpclass = pnVar4[iVar9].m_backend.fpclass;
      local_9e8.m_backend.prec_elem = pnVar4[iVar9].m_backend.prec_elem;
      pp_Var7 = (this->super_PostStep)._vptr_PostStep;
      pnVar13 = &local_308;
    }
    (*pp_Var7[6])(pnVar13,this);
    bVar6 = EQrel<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                      ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                        *)pcVar10,pnVar14,pnVar13);
    rStatus->data[this->m_i] = (uint)bVar6;
    cStatus->data[this->m_j] = BASIC;
    local_d18.fpclass = cpp_dec_float_finite;
    local_d18.prec_elem = 10;
    local_d18.data._M_elems[0] = 0;
    local_d18.data._M_elems[1] = 0;
    local_d18.data._M_elems[2] = 0;
    local_d18.data._M_elems[3] = 0;
    local_d18.data._M_elems[4] = 0;
    local_d18.data._M_elems[5] = 0;
    local_d18.data._M_elems._24_5_ = 0;
    local_d18.data._M_elems[7]._1_3_ = 0;
    local_d18.data._M_elems._32_5_ = 0;
    local_d18.data._M_elems[9]._1_3_ = 0;
    local_d18.exp = 0;
    local_d18.neg = false;
    boost::multiprecision::default_ops::
    eval_divide_default<boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
              (&local_d18,&local_d58,&local_c58);
    iVar9 = this->m_i;
    pnVar8 = (pVVar15->val).
             super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    *(ulong *)(pnVar8[iVar9].m_backend.data._M_elems + 8) =
         CONCAT35(local_d18.data._M_elems[9]._1_3_,local_d18.data._M_elems._32_5_);
    puVar1 = pnVar8[iVar9].m_backend.data._M_elems + 4;
    *(undefined8 *)puVar1 = local_d18.data._M_elems._16_8_;
    *(ulong *)(puVar1 + 2) =
         CONCAT35(local_d18.data._M_elems[7]._1_3_,local_d18.data._M_elems._24_5_);
    *(undefined8 *)&pnVar8[iVar9].m_backend.data = local_d18.data._M_elems._0_8_;
    *(undefined8 *)(pnVar8[iVar9].m_backend.data._M_elems + 2) = local_d18.data._M_elems._8_8_;
    pnVar8[iVar9].m_backend.exp = local_d18.exp;
    pnVar8[iVar9].m_backend.neg = local_d18.neg;
    pnVar8[iVar9].m_backend.fpclass = local_d18.fpclass;
    pnVar8[iVar9].m_backend.prec_elem = local_d18.prec_elem;
    this_00 = (cpp_dec_float<50u,int,void> *)
              ((r->val).
               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
               ._M_impl.super__Vector_impl_data._M_start + this->m_j);
    goto LAB_002a91c4;
  case ZERO:
    iVar9 = this->m_i;
    rStatus->data[iVar9] = BASIC;
    pcVar10 = &(local_d20->val).
               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
               ._M_impl.super__Vector_impl_data._M_start[iVar9].m_backend;
LAB_002a902a:
    boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator=
              (pcVar10,&(this->m_row_obj).m_backend);
    iVar9 = this->m_j;
    pnVar8 = (r->val).
             super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
LAB_002a903a:
    *(ulong *)(pnVar8[iVar9].m_backend.data._M_elems + 8) =
         CONCAT35(local_d58.data._M_elems[9]._1_3_,local_d58.data._M_elems._32_5_);
    puVar1 = pnVar8[iVar9].m_backend.data._M_elems + 4;
    *(undefined8 *)puVar1 = local_d58.data._M_elems._16_8_;
    *(ulong *)(puVar1 + 2) =
         CONCAT35(local_d58.data._M_elems[7]._1_3_,local_d58.data._M_elems._24_5_);
    *(undefined8 *)&pnVar8[iVar9].m_backend.data = local_d58.data._M_elems._0_8_;
    *(undefined8 *)(pnVar8[iVar9].m_backend.data._M_elems + 2) = local_d58.data._M_elems._8_8_;
    pnVar8[iVar9].m_backend.exp = local_d58.exp;
    pnVar8[iVar9].m_backend.neg = local_d58.neg;
    pnVar8[iVar9].m_backend.fpclass = local_d58.fpclass;
    pnVar8[iVar9].m_backend.prec_elem = local_d58.prec_elem;
    return;
  case BASIC:
    iVar9 = this->m_i;
    rStatus->data[iVar9] = BASIC;
    boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator=
              (&(local_d20->val).
                super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                ._M_impl.super__Vector_impl_data._M_start[iVar9].m_backend,
               &(this->m_row_obj).m_backend);
    goto LAB_002a91b5;
  default:
    goto switchD_002a871a_default;
  }
  (*pp_Var7[6])(pnVar13,this);
  bVar6 = EQrel<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                    ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                      *)pcVar10,pnVar14,pnVar13);
  rStatus->data[this->m_i] = (uint)bVar6;
LAB_002a9147:
  local_d18.fpclass = cpp_dec_float_finite;
  local_d18.prec_elem = 10;
  local_d18.data._M_elems[0] = 0;
  local_d18.data._M_elems[1] = 0;
  local_d18.data._M_elems[2] = 0;
  local_d18.data._M_elems[3] = 0;
  local_d18.data._M_elems[4] = 0;
  local_d18.data._M_elems[5] = 0;
  local_d18.data._M_elems._24_5_ = 0;
  local_d18.data._M_elems[7]._1_3_ = 0;
  local_d18.data._M_elems._32_5_ = 0;
  local_d18.data._M_elems[9]._1_3_ = 0;
  local_d18.exp = 0;
  local_d18.neg = false;
  boost::multiprecision::default_ops::
  eval_divide_default<boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
            (&local_d18,&local_d58,&local_c58);
  iVar9 = this->m_i;
  pnVar8 = (pVVar15->val).
           super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  *(ulong *)(pnVar8[iVar9].m_backend.data._M_elems + 8) =
       CONCAT35(local_d18.data._M_elems[9]._1_3_,local_d18.data._M_elems._32_5_);
  puVar1 = pnVar8[iVar9].m_backend.data._M_elems + 4;
  *(undefined8 *)puVar1 = local_d18.data._M_elems._16_8_;
  *(ulong *)(puVar1 + 2) = CONCAT35(local_d18.data._M_elems[7]._1_3_,local_d18.data._M_elems._24_5_)
  ;
  *(undefined8 *)&pnVar8[iVar9].m_backend.data = local_d18.data._M_elems._0_8_;
  *(undefined8 *)(pnVar8[iVar9].m_backend.data._M_elems + 2) = local_d18.data._M_elems._8_8_;
  pnVar8[iVar9].m_backend.exp = local_d18.exp;
  pnVar8[iVar9].m_backend.neg = local_d18.neg;
  pnVar8[iVar9].m_backend.fpclass = local_d18.fpclass;
  pnVar8[iVar9].m_backend.prec_elem = local_d18.prec_elem;
LAB_002a91b5:
  this_00 = (cpp_dec_float<50u,int,void> *)
            ((r->val).
             super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
             ._M_impl.super__Vector_impl_data._M_start + this->m_j);
LAB_002a91c4:
  boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=(this_00,0.0);
switchD_002a871a_default:
  return;
}

Assistant:

void SPxMainSM<R>::RowSingletonPS::execute(VectorBase<R>& x, VectorBase<R>& y, VectorBase<R>& s,
      VectorBase<R>& r,
      DataArray<typename SPxSolverBase<R>::VarStatus>& cStatus,
      DataArray<typename SPxSolverBase<R>::VarStatus>& rStatus, bool isOptimal) const
{
   // correcting the change of idx by deletion of the row:
   if(m_i != m_old_i)
   {
      y[m_old_i] = y[m_i];
      s[m_old_i] = s[m_i];
      rStatus[m_old_i] = rStatus[m_i];
   }

   R aij = m_col[m_i];
   assert(aij != 0.0);

   // primal:
   s[m_i] = aij * x[m_j];

   // dual & basis:
   R val = m_obj;

   for(int k = 0; k < m_col.size(); ++k)
   {
      if(m_col.index(k) != m_i)
         val -= m_col.value(k) * y[m_col.index(k)];
   }

   R newLo = (aij > 0) ? m_lhs / aij : m_rhs / aij; // implicit lhs
   R newUp = (aij > 0) ? m_rhs / aij : m_lhs / aij; // implicit rhs

   switch(cStatus[m_j])
   {
   case SPxSolverBase<R>::FIXED:
      if(newLo <= m_oldLo && newUp >= m_oldUp)
      {
         // this row is totally redundant, has not changed bound of xj
         rStatus[m_i] = SPxSolverBase<R>::BASIC;
         y[m_i] = m_row_obj;
      }
      else if(EQrel(newLo, newUp, this->feastol()))
      {
         // row is in the type  aij * xj = b
         assert(EQrel(newLo, x[m_j], this->feastol()));

         if(EQrel(m_oldLo, m_oldUp, this->feastol()))
         {
            // xj has been fixed in other row
            rStatus[m_i] = SPxSolverBase<R>::BASIC;
            y[m_i] = m_row_obj;
         }
         else if((EQrel(m_oldLo, x[m_j], this->feastol()) && r[m_j] <= -this->feastol())
                 || (EQrel(m_oldUp, x[m_j], this->feastol()) && r[m_j] >= this->feastol())
                 || (!EQrel(m_oldLo, x[m_j], this->feastol()) && !(EQrel(m_oldUp, x[m_j], this->feastol()))))
         {
            // if x_j on lower but reduced cost is negative, or x_j on upper but reduced cost is positive, or x_j not on bound: basic
            rStatus[m_i] = (EQrel(m_lhs, x[m_j] * aij,
                                  this->feastol())) ? SPxSolverBase<R>::ON_LOWER : SPxSolverBase<R>::ON_UPPER;
            cStatus[m_j] = SPxSolverBase<R>::BASIC;
            y[m_i] = val / aij;
            r[m_j] = 0.0;
         }
         else
         {
            // set x_j on one of the bound
            assert(EQrel(m_oldLo, x[m_j], this->feastol()) || EQrel(m_oldUp, x[m_j], this->feastol()));

            cStatus[m_j] = EQrel(m_oldLo, x[m_j],
                                 this->feastol()) ? SPxSolverBase<R>::ON_LOWER : SPxSolverBase<R>::ON_UPPER;
            rStatus[m_i] = SPxSolverBase<R>::BASIC;
            y[m_i] = m_row_obj;
            r[m_j] = val;
         }
      }
      else if(EQrel(newLo, m_oldUp, this->feastol()))
      {
         // row is in the type  xj >= b/aij, try to set xj on upper
         if(r[m_j] >= this->feastol())
         {
            // the reduced cost is positive, xj should in the basic
            assert(EQrel(m_rhs / aij, x[m_j], this->feastol()) || EQrel(m_lhs / aij, x[m_j], this->feastol()));

            rStatus[m_i] = (EQrel(m_lhs / aij, x[m_j],
                                  this->feastol())) ? SPxSolverBase<R>::ON_LOWER : SPxSolverBase<R>::ON_UPPER;
            cStatus[m_j] = SPxSolverBase<R>::BASIC;
            y[m_i] = val / aij;
            r[m_j] = 0.0;
         }
         else
         {
            assert(EQrel(m_oldUp, x[m_j], this->feastol()));

            cStatus[m_j] = SPxSolverBase<R>::ON_UPPER;
            rStatus[m_i] = SPxSolverBase<R>::BASIC;
            y[m_i] = m_row_obj;
            r[m_j] = val;
         }
      }
      else if(EQrel(newUp, m_oldLo, this->feastol()))
      {
         // row is in the type  xj <= b/aij, try to set xj on lower
         if(r[m_j] <= -this->feastol())
         {
            // the reduced cost is negative, xj should in the basic
            assert(EQrel(m_rhs / aij, x[m_j], this->feastol()) || EQrel(m_lhs / aij, x[m_j], this->feastol()));

            rStatus[m_i] = (EQrel(m_lhs / aij, x[m_j],
                                  this->feastol())) ? SPxSolverBase<R>::ON_LOWER : SPxSolverBase<R>::ON_UPPER;
            cStatus[m_j] = SPxSolverBase<R>::BASIC;
            y[m_i] = val / aij;
            r[m_j] = 0.0;
         }
         else
         {
            assert(EQrel(m_oldLo, x[m_j], this->feastol()));

            cStatus[m_j] = SPxSolverBase<R>::ON_LOWER;
            rStatus[m_i] = SPxSolverBase<R>::BASIC;
            y[m_i] = m_row_obj;
            r[m_j] = val;
         }
      }
      else
      {
         // the variable is set to FIXED by other constraints, i.e., this singleton row is redundant
         rStatus[m_i] = SPxSolverBase<R>::BASIC;
         y[m_i] = m_row_obj;
      }

      break;

   case SPxSolverBase<R>::BASIC:
      rStatus[m_i] = SPxSolverBase<R>::BASIC;
      y[m_i] = m_row_obj;
      r[m_j] = 0.0;
      break;

   case SPxSolverBase<R>::ON_LOWER:
      if(EQrel(m_oldLo, x[m_j], this->feastol())) // xj may stay on lower
      {
         rStatus[m_i] = SPxSolverBase<R>::BASIC;
         y[m_i] = m_row_obj;
         r[m_j] = val;
      }
      else // if reduced costs are negative or old lower bound not equal to xj, we need to change xj into the basis
      {
         assert(!isOptimal || EQrel(m_rhs / aij, x[m_j], this->feastol())
                || EQrel(m_lhs / aij, x[m_j], this->feastol()));

         cStatus[m_j] = SPxSolverBase<R>::BASIC;
         rStatus[m_i] = (EQrel(m_lhs / aij, x[m_j],
                               this->feastol())) ? SPxSolverBase<R>::ON_LOWER : SPxSolverBase<R>::ON_UPPER;
         y[m_i] = val / aij;
         r[m_j] = 0.0;
      }

      break;

   case SPxSolverBase<R>::ON_UPPER:
      if(EQrel(m_oldUp, x[m_j], this->feastol())) // xj may stay on upper
      {
         rStatus[m_i] = SPxSolverBase<R>::BASIC;
         y[m_i] = m_row_obj;
         r[m_j] = val;
      }
      else // if reduced costs are positive or old upper bound not equal to xj, we need to change xj into the basis
      {
         assert(!isOptimal || EQrel(m_rhs / aij, x[m_j], this->feastol())
                || EQrel(m_lhs / aij, x[m_j], this->feastol()));

         cStatus[m_j] = SPxSolverBase<R>::BASIC;
         rStatus[m_i] = (EQrel(m_lhs / aij, x[m_j],
                               this->feastol())) ? SPxSolverBase<R>::ON_LOWER : SPxSolverBase<R>::ON_UPPER;
         y[m_i] = val / aij;
         r[m_j] = 0.0;
      }

      break;

   case SPxSolverBase<R>::ZERO:
      rStatus[m_i] = SPxSolverBase<R>::BASIC;
      y[m_i] = m_row_obj;
      r[m_j] = val;
      break;

   default:
      break;
   }

#ifdef SOPLEX_CHECK_BASIS_DIM

   if(!this->checkBasisDim(rStatus, cStatus))
   {
      throw SPxInternalCodeException("XMAISM17 Dimension doesn't match after this step.");
   }

#endif
}